

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_immediate_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_dbfc4::CpuImmediateTest_sbceb_carry_and_overflow_Test::
~CpuImmediateTest_sbceb_carry_and_overflow_Test
          (CpuImmediateTest_sbceb_carry_and_overflow_Test *this)

{
  CpuImmediateTest_sbceb_carry_and_overflow_Test *this_local;
  
  ~CpuImmediateTest_sbceb_carry_and_overflow_Test(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuImmediateTest, sbceb_carry_and_overflow) {
    registers.a = 0xD0;
    registers.p = C_FLAG;
    expected.p = V_FLAG | C_FLAG;
    expected.a = 0x60;
    memory_content = 0x70;

    run_instruction(SBC_IMMEB);
}